

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXAlgorithms.h
# Opt level: O2

string * __thiscall
ZXing::ToString<unsigned_int,void>(string *__return_storage_ptr__,ZXing *this,uint val,int len)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  allocator<char> local_41;
  uint *local_40;
  long local_38;
  uint local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)val);
  uVar2 = (ulong)val;
  for (uVar3 = (ulong)this & 0xffffffff; (0 < (int)uVar2 && ((int)uVar3 != 0)); uVar3 = uVar3 / 10)
  {
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar2 - 1] = (byte)(uVar3 % 10) | 0x30;
    uVar2 = uVar2 - 1;
  }
  if ((int)uVar3 == 0) {
    return __return_storage_ptr__;
  }
  plVar1 = (long *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Invalid value",&local_41);
  *plVar1 = (long)(plVar1 + 2);
  if (local_40 == &local_30) {
    *(uint *)(plVar1 + 2) = local_30;
    *(undefined4 *)((long)plVar1 + 0x14) = uStack_2c;
    *(undefined4 *)(plVar1 + 3) = uStack_28;
    *(undefined4 *)((long)plVar1 + 0x1c) = uStack_24;
  }
  else {
    *plVar1 = (long)local_40;
    plVar1[2] = CONCAT44(uStack_2c,local_30);
  }
  plVar1[1] = local_38;
  local_38 = 0;
  local_30 = local_30 & 0xffffff00;
  plVar1[4] = (long)"src/ZXAlgorithms.h";
  *(undefined2 *)(plVar1 + 5) = 0x74;
  *(undefined1 *)((long)plVar1 + 0x2a) = 1;
  local_40 = &local_30;
  __cxa_throw(plVar1,&Error::typeinfo,Error::~Error);
}

Assistant:

std::string ToString(T val, int len)
{
	std::string result(len--, '0');
	if (val < 0)
		throw FormatError("Invalid value");
	for (; len >= 0 && val != 0; --len, val /= 10)
		result[len] = '0' + val % 10;
	if (val)
		throw FormatError("Invalid value");
	return result;
}